

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void __thiscall
icu_63::NFRule::extractSubstitutions
          (NFRule *this,NFRuleSet *ruleSet,UnicodeString *ruleText,NFRule *predecessor,
          UErrorCode *status)

{
  RuleBasedNumberFormat *this_00;
  UPluralType pluralType_00;
  UBool UVar1;
  int32_t start;
  NFSubstitution *pNVar2;
  PluralFormat *pPVar3;
  int local_17c;
  UnicodeString local_170;
  undefined4 local_12c;
  ConstChar16Ptr local_128;
  UnicodeString local_120;
  ConstChar16Ptr local_d0;
  UnicodeString local_c8;
  UPluralType local_84;
  undefined1 local_80 [4];
  UPluralType pluralType;
  UnicodeString type;
  int32_t endType;
  int32_t pluralRuleEnd;
  int32_t pluralRuleStart;
  UErrorCode *status_local;
  NFRule *predecessor_local;
  UnicodeString *ruleText_local;
  NFRuleSet *ruleSet_local;
  NFRule *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    return;
  }
  UnicodeString::operator=(&this->fRuleText,ruleText);
  pNVar2 = extractSubstitution(this,ruleSet,predecessor,status);
  this->sub1 = pNVar2;
  if (this->sub1 == (NFSubstitution *)0x0) {
    this->sub2 = (NFSubstitution *)0x0;
  }
  else {
    pNVar2 = extractSubstitution(this,ruleSet,predecessor,status);
    this->sub2 = pNVar2;
  }
  start = UnicodeString::indexOf(&this->fRuleText,L"$(",-1,0);
  if (start < 0) {
    local_17c = -1;
  }
  else {
    local_17c = UnicodeString::indexOf(&this->fRuleText,L")$",-1,start);
  }
  if (local_17c < 0) {
    return;
  }
  type.fUnion._52_4_ = UnicodeString::indexOf(&this->fRuleText,L',',start);
  if ((int)type.fUnion._52_4_ < 0) {
    *status = U_PARSE_ERROR;
    return;
  }
  UnicodeString::tempSubString
            ((UnicodeString *)local_80,&this->fRuleText,start + 2,(type.fUnion._52_4_ - start) + -2)
  ;
  ConstChar16Ptr::ConstChar16Ptr(&local_d0,L"cardinal");
  UnicodeString::UnicodeString(&local_c8,'\x01',&local_d0,-1);
  UVar1 = UnicodeString::startsWith((UnicodeString *)local_80,&local_c8);
  UnicodeString::~UnicodeString(&local_c8);
  ConstChar16Ptr::~ConstChar16Ptr(&local_d0);
  if (UVar1 == '\0') {
    ConstChar16Ptr::ConstChar16Ptr(&local_128,L"ordinal");
    UnicodeString::UnicodeString(&local_120,'\x01',&local_128,-1);
    UVar1 = UnicodeString::startsWith((UnicodeString *)local_80,&local_120);
    UnicodeString::~UnicodeString(&local_120);
    ConstChar16Ptr::~ConstChar16Ptr(&local_128);
    if (UVar1 == '\0') {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      local_12c = 1;
      goto LAB_002cf14a;
    }
    local_84 = UPLURAL_TYPE_ORDINAL;
  }
  else {
    local_84 = UPLURAL_TYPE_CARDINAL;
  }
  pluralType_00 = local_84;
  this_00 = this->formatter;
  UnicodeString::tempSubString
            (&local_170,&this->fRuleText,type.fUnion._52_4_ + 1,~type.fUnion._52_4_ + local_17c);
  pPVar3 = RuleBasedNumberFormat::createPluralFormat(this_00,pluralType_00,&local_170,status);
  this->rulePatternFormat = pPVar3;
  UnicodeString::~UnicodeString(&local_170);
  local_12c = 0;
LAB_002cf14a:
  UnicodeString::~UnicodeString((UnicodeString *)local_80);
  return;
}

Assistant:

void
NFRule::extractSubstitutions(const NFRuleSet* ruleSet,
                             const UnicodeString &ruleText,
                             const NFRule* predecessor,
                             UErrorCode& status)
{
    if (U_FAILURE(status)) {
        return;
    }
    fRuleText = ruleText;
    sub1 = extractSubstitution(ruleSet, predecessor, status);
    if (sub1 == NULL) {
        // Small optimization. There is no need to create a redundant NullSubstitution.
        sub2 = NULL;
    }
    else {
        sub2 = extractSubstitution(ruleSet, predecessor, status);
    }
    int32_t pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
    int32_t pluralRuleEnd = (pluralRuleStart >= 0 ? fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart) : -1);
    if (pluralRuleEnd >= 0) {
        int32_t endType = fRuleText.indexOf(gComma, pluralRuleStart);
        if (endType < 0) {
            status = U_PARSE_ERROR;
            return;
        }
        UnicodeString type(fRuleText.tempSubString(pluralRuleStart + 2, endType - pluralRuleStart - 2));
        UPluralType pluralType;
        if (type.startsWith(UNICODE_STRING_SIMPLE("cardinal"))) {
            pluralType = UPLURAL_TYPE_CARDINAL;
        }
        else if (type.startsWith(UNICODE_STRING_SIMPLE("ordinal"))) {
            pluralType = UPLURAL_TYPE_ORDINAL;
        }
        else {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        rulePatternFormat = formatter->createPluralFormat(pluralType,
                fRuleText.tempSubString(endType + 1, pluralRuleEnd - endType - 1), status);
    }
}